

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.cpp
# Opt level: O3

void luaT_init(lua_State *L)

{
  byte *pbVar1;
  char *__s;
  size_t l;
  TString *pTVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    __s = *(char **)((long)luaT_init::luaT_eventname + lVar3);
    l = strlen(__s);
    pTVar2 = luaS_newlstr(L,__s,l);
    *(TString **)((long)L->l_G->tmname + lVar3) = pTVar2;
    pbVar1 = (byte *)(*(long *)((long)L->l_G->tmname + lVar3) + 9);
    *pbVar1 = *pbVar1 | 0x20;
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x88);
  return;
}

Assistant:

void luaT_init (lua_State *L) {
  static const char *const luaT_eventname[] = {  /* ORDER TM */
    "__index", "__newindex",
    "__gc", "__mode", "__eq",
    "__add", "__sub", "__mul", "__div", "__mod",
    "__pow", "__unm", "__len", "__lt", "__le",
    "__concat", "__call"
  };
  int i;
  for (i=0; i<TM_N; i++) {
    G(L)->tmname[i] = luaS_new(L, luaT_eventname[i]);
    luaS_fix(G(L)->tmname[i]);  /* never collect these names */
  }
}